

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmFileTimeCache *this_00;
  _func_int *p_Var3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Encoding EVar11;
  string *psVar12;
  path *this_01;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  bool bVar13;
  bool bVar14;
  string_view arg;
  string_view value;
  int result;
  undefined4 uStack_94c;
  pointer local_948;
  undefined4 local_92c;
  string depends;
  cmDependsCompiler depsManager;
  string dirInfoFile;
  int result_1;
  undefined4 uStack_8c4;
  size_type local_8c0;
  string dependFile;
  string targetDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depFiles;
  string message_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  DependencyMap validDependencies;
  cmDependsC checker;
  
  bVar7 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar7) || (bVar7 = cmSystemTools::GetErrorOccurredFlag(), bVar7)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checker,"Target DependInfo.cmake file not found",
               (allocator<char> *)&validDependencies);
    cmSystemTools::Error((string *)&checker);
    std::__cxx11::string::~string((string *)&checker);
  }
  CheckMultipleOutputs(this,verbose);
  cmsys::SystemTools::GetFilenamePath(&targetDir,tgtInfo);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&checker,"CMAKE_DEPENDS_LANGUAGES",(allocator<char> *)&validDependencies);
  psVar12 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&checker);
  sVar2 = psVar12->_M_string_length;
  std::__cxx11::string::~string((string *)&checker);
  if (sVar2 == 0) {
    bVar7 = true;
  }
  else {
    std::operator+(&depends,&targetDir,"/depend.internal");
    std::operator+(&dependFile,&targetDir,"/depend.make");
    this_00 = (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               CMakeInstance->FileTimeCache)._M_t.
              super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
              super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
              super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
    bVar8 = cmFileTimeCache::Compare(this_00,&depends,tgtInfo,&result);
    bVar13 = result < 0;
    if (verbose && (!bVar8 || bVar13)) {
      checker.super_cmDepends._vptr_cmDepends = (_func_int **)0xa;
      checker.super_cmDepends.LocalGenerator =
           (cmLocalUnixMakefileGenerator3 *)anon_var_dwarf_17b38b1;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (tgtInfo->_M_dataplus)._M_p;
      validDependencies._M_t._M_impl._0_8_ = tgtInfo->_M_string_length;
      cmStrCat<char[27],std::__cxx11::string,char[4]>
                (&dirInfoFile,(cmAlphaNum *)&checker,(cmAlphaNum *)&validDependencies,
                 (char (*) [27])"\" is newer than depender \"",&depends,(char (*) [4])0x63d313);
      cmSystemTools::Stdout(&dirInfoFile);
      std::__cxx11::string::~string((string *)&dirInfoFile);
    }
    psVar12 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    checker.super_cmDepends.LocalGenerator =
         (cmLocalUnixMakefileGenerator3 *)(psVar12->_M_dataplus)._M_p;
    checker.super_cmDepends._vptr_cmDepends = (_func_int **)psVar12->_M_string_length;
    validDependencies._M_t._M_impl._0_8_ = 0x2b;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_16b56e8;
    cmStrCat<>(&dirInfoFile,(cmAlphaNum *)&checker,(cmAlphaNum *)&validDependencies);
    bVar9 = cmFileTimeCache::Compare(this_00,&depends,&dirInfoFile,&result_1);
    bVar14 = result_1 < 0;
    if (!bVar9 || bVar14) {
      if (verbose) {
        checker.super_cmDepends._vptr_cmDepends = (_func_int **)0xa;
        checker.super_cmDepends.LocalGenerator =
             (cmLocalUnixMakefileGenerator3 *)anon_var_dwarf_17b38b1;
        validDependencies._M_t._M_impl._0_8_ = dirInfoFile._M_string_length;
        validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             dirInfoFile._M_dataplus._M_p;
        cmStrCat<char[27],std::__cxx11::string,char[4]>
                  ((string *)&result,(cmAlphaNum *)&checker,(cmAlphaNum *)&validDependencies,
                   (char (*) [27])"\" is newer than depender \"",&depends,(char (*) [4])0x63d313);
        cmSystemTools::Stdout((string *)&result);
        std::__cxx11::string::~string((string *)&result);
      }
      std::__cxx11::string::~string((string *)&dirInfoFile);
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
      ;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_004141ef:
      if (verbose) {
        cmsys::SystemTools::GetFilenameName((string *)&result,&targetDir);
        std::__cxx11::string::substr((ulong)&checker,(ulong)&result);
        std::__cxx11::string::operator=((string *)&result,(string *)&checker);
        std::__cxx11::string::~string((string *)&checker);
        checker.super_cmDepends._vptr_cmDepends = (_func_int **)0x20;
        checker.super_cmDepends.LocalGenerator =
             (cmLocalUnixMakefileGenerator3 *)anon_var_dwarf_17b38d8;
        dirInfoFile._M_string_length = CONCAT44(uStack_94c,result);
        dirInfoFile._M_dataplus._M_p = local_948;
        cmStrCat<>((string *)&result_1,(cmAlphaNum *)&checker,(cmAlphaNum *)&dirInfoFile);
        cmSystemTools::MakefileColorEcho(0x106,(char *)CONCAT44(uStack_8c4,result_1),true,color);
        std::__cxx11::string::~string((string *)&result_1);
        std::__cxx11::string::~string((string *)&result);
      }
      bVar7 = ScanDependencies(this,&targetDir,&dependFile,&depends,&validDependencies);
    }
    else {
      std::__cxx11::string::~string((string *)&dirInfoFile);
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
      ;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cmDependsC::cmDependsC(&checker);
      checker.super_cmDepends.Verbose = verbose;
      checker.super_cmDepends.FileTimeCache = this_00;
      bVar10 = cmDepends::Check(&checker.super_cmDepends,&dependFile,&depends,&validDependencies);
      cmDependsC::~cmDependsC(&checker);
      bVar7 = true;
      if ((!bVar8 || bVar13) || ((!bVar9 || bVar14) || !bVar10)) goto LAB_004141ef;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&validDependencies._M_t);
    std::__cxx11::string::~string((string *)&dependFile);
    std::__cxx11::string::~string((string *)&depends);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&checker,"CMAKE_DEPENDS_DEPENDENCY_FILES",
             (allocator<char> *)&validDependencies);
  psVar12 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&checker);
  std::__cxx11::string::string((string *)&depends,(string *)psVar12);
  std::__cxx11::string::~string((string *)&checker);
  if (depends._M_string_length == 0) goto LAB_00414704;
  arg._M_str = depends._M_dataplus._M_p;
  arg._M_len = depends._M_string_length;
  cmExpandedList_abi_cxx11_(&depFiles,arg,true);
  std::operator+(&dependFile,&targetDir,"/compiler_depend.internal");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &targetDir,"/compiler_depend.make");
  dirInfoFile.field_2._8_8_ = &dirInfoFile._M_string_length;
  dirInfoFile._M_string_length = (ulong)dirInfoFile._M_string_length._4_4_ << 0x20;
  dirInfoFile.field_2._M_allocated_capacity = 0;
  depsManager.Verbose = false;
  depsManager.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&checker,"CMAKE_DEPENDS_IN_PROJECT_ONLY",
             (allocator<char> *)&validDependencies);
  psVar12 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&checker);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar12->_M_dataplus)._M_p;
  bVar8 = cmValue::IsOn((cmValue *)psVar12->_M_string_length,value);
  std::__cxx11::string::~string((string *)&checker);
  depsManager.Verbose = verbose;
  depsManager.LocalGenerator = this;
  if (bVar8) {
    local_92c = (int)CONCAT71(in_register_00000011,verbose);
    psVar12 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
    p_Var3 = (_func_int *)(psVar12->_M_dataplus)._M_p;
    p_Var4 = (_func_int *)psVar12->_M_string_length;
    psVar12 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    p_Var5 = (_func_int *)(psVar12->_M_dataplus)._M_p;
    p_Var6 = (_func_int *)psVar12->_M_string_length;
    checker.super_cmDepends.Verbose = false;
    checker.super_cmDepends._17_7_ = 0;
    checker.super_cmDepends.FileTimeCache = (cmFileTimeCache *)0x0;
    checker.super_cmDepends._vptr_cmDepends = (_func_int **)0x0;
    checker.super_cmDepends.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
    checker.super_cmDepends._vptr_cmDepends = (_func_int **)operator_new(0x20);
    *checker.super_cmDepends._vptr_cmDepends = p_Var4;
    checker.super_cmDepends._vptr_cmDepends[1] = p_Var3;
    checker.super_cmDepends._vptr_cmDepends[2] = p_Var6;
    checker.super_cmDepends._vptr_cmDepends[3] = p_Var5;
    checker.super_cmDepends.FileTimeCache =
         (cmFileTimeCache *)
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_invoke;
    checker.super_cmDepends._16_8_ =
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_manager;
    verbose = SUB41(local_92c,0);
  }
  else {
    checker.super_cmDepends.Verbose = false;
    checker.super_cmDepends._17_7_ = 0;
    checker.super_cmDepends.FileTimeCache = (cmFileTimeCache *)0x0;
    checker.super_cmDepends._vptr_cmDepends = (_func_int **)0x0;
    checker.super_cmDepends.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
  }
  bVar8 = cmDependsCompiler::CheckDependencies
                    (&depsManager,&dependFile,&depFiles,(DependencyMap *)&dirInfoFile,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&checker);
  std::_Function_base::~_Function_base((_Function_base *)&checker);
  if (bVar8) {
LAB_004144f1:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&dirInfoFile);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&dependFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depFiles);
  }
  else {
    if (verbose != false) {
      std::__cxx11::string::string((string *)&local_830,(string *)&targetDir);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)&validDependencies,&local_830,generic_format);
      cmCMakePath::GetFileName((cmCMakePath *)&checker,(cmCMakePath *)&validDependencies);
      this_01 = &cmCMakePath::RemoveExtension((cmCMakePath *)&checker)->Path;
      std::filesystem::__cxx11::path::generic_string((string *)&result_1,this_01);
      std::filesystem::__cxx11::path::~path((path *)&checker);
      std::filesystem::__cxx11::path::~path((path *)&validDependencies);
      std::__cxx11::string::~string((string *)&local_830);
      checker.super_cmDepends._vptr_cmDepends = (_func_int **)0x36;
      checker.super_cmDepends.LocalGenerator =
           (cmLocalUnixMakefileGenerator3 *)anon_var_dwarf_17b3935;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = uStack_8c4;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = result_1;
      validDependencies._M_t._M_impl._0_8_ = local_8c0;
      cmStrCat<>(&message_1,(cmAlphaNum *)&checker,(cmAlphaNum *)&validDependencies);
      cmSystemTools::MakefileColorEcho(0x106,message_1._M_dataplus._M_p,true,color);
      std::__cxx11::string::~string((string *)&message_1);
      std::__cxx11::string::~string((string *)&result_1);
    }
    EVar11 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&checker,(string *)&result,false,EVar11);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&checker,true);
    if ((*(byte *)((long)&checker.super_cmDepends.Language._M_dataplus._M_p +
                  (long)checker.super_cmDepends._vptr_cmDepends[-3]) & 5) == 0) {
      EVar11 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                 _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&validDependencies,&dependFile,false,EVar11);
      if ((*(byte *)((long)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                    + *(long *)(validDependencies._M_t._M_impl._0_8_ + -0x18)) & 5) == 0) {
        WriteDisclaimer(this,(ostream *)&checker);
        WriteDisclaimer(this,(ostream *)&validDependencies);
        cmDependsCompiler::WriteDependencies
                  (&depsManager,(DependencyMap *)&dirInfoFile,(ostream *)&checker,
                   (ostream *)&validDependencies);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&validDependencies);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&checker);
        goto LAB_004144f1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&validDependencies);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&checker);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&dirInfoFile);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&dependFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depFiles);
    bVar7 = false;
  }
LAB_00414704:
  std::__cxx11::string::~string((string *)&depends);
  std::__cxx11::string::~string((string *)&targetDir);
  return bVar7;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  bool status = true;

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  if (!this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
    // dependencies are managed by CMake itself

    std::string const internalDependFile = targetDir + "/depend.internal";
    std::string const dependFile = targetDir + "/depend.make";

    // If the target DependInfo.cmake file has changed since the last
    // time dependencies were scanned then force rescanning.  This may
    // happen when a new source file is added and CMake regenerates the
    // project but no other sources were touched.
    bool needRescanDependInfo = false;
    cmFileTimeCache* ftc =
      this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
    {
      int result;
      if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", tgtInfo,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDependInfo = true;
      }
    }

    // If the directory information is newer than depend.internal, include
    // dirs may have changed. In this case discard all old dependencies.
    bool needRescanDirInfo = false;
    {
      std::string dirInfoFile =
        cmStrCat(this->GetCurrentBinaryDirectory(),
                 "/CMakeFiles/CMakeDirectoryInformation.cmake");
      int result;
      if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
          result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dirInfoFile,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDirInfo = true;
      }
    }

    // Check the implicit dependencies to see if they are up to date.
    // The build.make file may have explicit dependencies for the object
    // files but these will not affect the scanning process so they need
    // not be considered.
    cmDepends::DependencyMap validDependencies;
    bool needRescanDependencies = false;
    if (!needRescanDirInfo) {
      cmDependsC checker;
      checker.SetVerbose(verbose);
      checker.SetFileTimeCache(ftc);
      // cmDependsC::Check() fills the vector validDependencies() with the
      // dependencies for those files where they are still valid, i.e.
      // neither the files themselves nor any files they depend on have
      // changed. We don't do that if the CMakeDirectoryInformation.cmake
      // file has changed, because then potentially all dependencies have
      // changed. This information is given later on to cmDependsC, which
      // then only rescans the files where it did not get valid dependencies
      // via this dependency vector. This means that in the normal case, when
      // only few or one file have been edited, then also only this one file
      // is actually scanned again, instead of all files for this target.
      needRescanDependencies =
        !checker.Check(dependFile, internalDependFile, validDependencies);
    }

    if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
      // The dependencies must be regenerated.
      if (verbose) {
        std::string targetName = cmSystemTools::GetFilenameName(targetDir);
        targetName = targetName.substr(0, targetName.length() - 4);
        std::string message =
          cmStrCat("Scanning dependencies of target ", targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      status = this->ScanDependencies(targetDir, dependFile,
                                      internalDependFile, validDependencies);
    }
  }

  auto depends =
    this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
  if (!depends.empty()) {
    // dependencies are managed by compiler
    auto depFiles = cmExpandedList(depends, true);
    std::string const internalDepFile =
      targetDir + "/compiler_depend.internal";
    std::string const depFile = targetDir + "/compiler_depend.make";
    cmDepends::DependencyMap dependencies;
    cmDependsCompiler depsManager;
    bool projectOnly = cmIsOn(
      this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_IN_PROJECT_ONLY"));

    depsManager.SetVerbose(verbose);
    depsManager.SetLocalGenerator(this);

    if (!depsManager.CheckDependencies(
          internalDepFile, depFiles, dependencies,
          projectOnly ? NotInProjectDir(this->GetSourceDirectory(),
                                        this->GetBinaryDirectory())
                      : std::function<bool(const std::string&)>())) {
      // regenerate dependencies files
      if (verbose) {
        std::string targetName = cmCMakePath(targetDir)
                                   .GetFileName()
                                   .RemoveExtension()
                                   .GenericString();
        auto message =
          cmStrCat("Consolidate compiler generated dependencies of target ",
                   targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      // Open the make depends file.  This should be copy-if-different
      // because the make tool may try to reload it needlessly otherwise.
      cmGeneratedFileStream ruleFileStream(
        depFile, false, this->GlobalGenerator->GetMakefileEncoding());
      ruleFileStream.SetCopyIfDifferent(true);
      if (!ruleFileStream) {
        return false;
      }

      // Open the cmake dependency tracking file.  This should not be
      // copy-if-different because dependencies are re-scanned when it is
      // older than the DependInfo.cmake.
      cmGeneratedFileStream internalRuleFileStream(
        internalDepFile, false, this->GlobalGenerator->GetMakefileEncoding());
      if (!internalRuleFileStream) {
        return false;
      }

      this->WriteDisclaimer(ruleFileStream);
      this->WriteDisclaimer(internalRuleFileStream);

      depsManager.WriteDependencies(dependencies, ruleFileStream,
                                    internalRuleFileStream);
    }
  }

  // The dependencies are already up-to-date.
  return status;
}